

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_shared_mutex.hpp
# Opt level: O2

bool __thiscall
yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>::try_lock
          (basic_shared_mutex<yamc::rwlock::PhaseFairness> *this)

{
  bool bVar1;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x60))->__data);
  bVar1 = detail::shared_mutex_base<yamc::rwlock::PhaseFairness>::impl_try_lock
                    ((shared_mutex_base<yamc::rwlock::PhaseFairness> *)this);
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x60));
  return bVar1;
}

Assistant:

bool try_lock()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    return base::impl_try_lock();
  }